

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

int stbtt__run_charstring(stbtt_fontinfo *info,int glyph_index,stbtt__csctx *c)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  byte bVar11;
  stbtt__buf fontdict;
  stbtt_uint32 sVar12;
  ulong uVar13;
  int *piVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  uchar *puVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  int iVar30;
  long lVar31;
  uint uVar32;
  float fVar33;
  float dy1;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  stbtt__buf b;
  stbtt__buf sVar39;
  ulong uVar40;
  undefined4 in_stack_fffffffffffffdc0;
  int iVar41;
  stbtt__buf local_238;
  float local_228;
  int local_224;
  uchar *puVar42;
  ulong uVar43;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  float s [48];
  stbtt__buf local_108;
  float local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  ulong local_e8;
  int *local_e0;
  stbtt__buf subr_stack [10];
  
  local_108 = info->subrs;
  local_238 = stbtt__cff_index_get(info->charstrings,glyph_index);
  uVar17 = local_238._8_8_;
  uVar13 = uVar17 >> 0x20;
  if (local_238.size <= local_238.cursor) {
switchD_0017222a_default:
    return 0;
  }
  local_e8 = (ulong)(uint)glyph_index;
  uVar19 = (ulong)(glyph_index + 1);
  local_e0 = &(info->gsubrs).cursor;
  iVar41 = 1;
  uVar43 = 0;
  puVar42 = (uchar *)0x0;
  local_224 = 0;
  uVar28 = 0;
  uVar40 = uVar19;
LAB_00171fa2:
  fVar38 = s[9];
  fVar33 = s[8];
  dy1 = s[7];
  fVar36 = s[6];
  fVar35 = s[5];
  fVar37 = s[4];
  fVar34 = s[2];
  iVar20 = (int)uVar17;
  uVar17 = (long)iVar20 + 1;
  iVar22 = (int)uVar17;
  local_238.cursor = iVar22;
  bVar11 = local_238.data[iVar20];
  uVar32 = (uint)uVar28;
  iVar30 = (int)uVar13;
  switch(bVar11) {
  case 1:
  case 3:
  case 0x12:
  case 0x17:
    uVar43 = (ulong)(uint)((int)uVar43 + ((int)((int)(uVar28 >> 0x1f) + uVar32) >> 1));
    goto LAB_0017260b;
  default:
    if (bVar11 < 0x20 && bVar11 != 0x1c) {
      return 0;
    }
    if (bVar11 == 0xff) {
      uVar15 = 0;
      iVar22 = 4;
      do {
        iVar20 = (int)uVar17;
        if (iVar20 < iVar30) {
          uVar17 = (ulong)(iVar20 + 1);
          uVar21 = (uint)local_238.data[iVar20];
        }
        else {
          uVar21 = 0;
        }
        uVar15 = uVar15 << 8 | uVar21;
        iVar22 = iVar22 + -1;
      } while (iVar22 != 0);
      local_238.cursor = (int)uVar17;
      fVar33 = (float)(int)uVar15 * 1.5258789e-05;
      uVar19 = uVar40;
    }
    else {
      if ((iVar20 < 0) || (iVar30 < iVar20)) goto LAB_00172c0f;
      local_238.cursor = iVar20;
      sVar12 = stbtt__cff_int(&local_238);
      fVar33 = (float)(int)(short)sVar12;
      uVar19 = uVar40;
    }
    if (0x2f < (int)uVar32) {
      return 0;
    }
    uVar29 = (ulong)(uVar32 + 1);
    s[(int)uVar32] = fVar33;
    uVar40 = uVar19;
    break;
  case 4:
    if ((int)uVar32 < 1) {
      return 0;
    }
    fVar34 = s[uVar32 - 1];
    fVar33 = 0.0;
    goto LAB_0017246b;
  case 5:
    if ((int)uVar32 < 2) {
      return 0;
    }
    uVar13 = 1;
    uVar19 = uVar40;
    do {
      uVar2 = c->x;
      uVar7 = c->y;
      fVar33 = (float)uVar2 + (float)*(undefined8 *)(s + (uVar13 - 1));
      fVar34 = (float)uVar7 + (float)((ulong)*(undefined8 *)(s + (uVar13 - 1)) >> 0x20);
      c->x = fVar33;
      c->y = fVar34;
      uVar29 = 0;
      stbtt__csctx_v(c,'\x02',(int)fVar33,(int)fVar34,0,0,0,0);
      uVar13 = uVar13 + 2;
      uVar40 = uVar19;
    } while (uVar13 < uVar28);
    break;
  case 6:
    iVar30 = 0;
    if ((int)uVar32 < 1) {
      return 0;
    }
    for (; uVar19 = uVar40, iVar30 < (int)uVar32; iVar30 = iVar30 + 1) {
      uVar4 = c->x;
      uVar9 = c->y;
      fVar33 = s[iVar30];
      c->x = fVar33 + (float)uVar4;
      c->y = (float)uVar9 + 0.0;
      stbtt__csctx_v(c,'\x02',(int)(fVar33 + (float)uVar4),(int)((float)uVar9 + 0.0),0,0,0,0);
      iVar30 = iVar30 + 1;
LAB_00172b7c:
      uVar19 = uVar40;
      if ((int)uVar32 <= iVar30) break;
      uVar5 = c->x;
      uVar10 = c->y;
      fVar33 = s[iVar30];
      c->x = (float)uVar5 + 0.0;
      c->y = fVar33 + (float)uVar10;
      stbtt__csctx_v(c,'\x02',(int)((float)uVar5 + 0.0),(int)(fVar33 + (float)uVar10),0,0,0,0);
    }
    goto LAB_00172bd3;
  case 7:
    iVar30 = 0;
    if (0 < (int)uVar32) goto LAB_00172b7c;
    return 0;
  case 8:
    if ((int)uVar32 < 6) {
      return 0;
    }
    uVar13 = 5;
    do {
      stbtt__csctx_rccurve_to
                (c,*(float *)((long)&uStack_1e0 + uVar13 * 4 + 4),
                 *(float *)((long)&local_1d8 + uVar13 * 4),
                 *(float *)((long)&local_1d8 + uVar13 * 4 + 4),s[uVar13 - 2],s[uVar13 - 1],s[uVar13]
                );
      uVar13 = uVar13 + 6;
    } while (uVar13 < uVar28);
    goto LAB_0017260b;
  case 10:
    iVar30 = 1;
    if (local_224 == 0) {
      uVar15 = (info->fdselect).size;
      if (uVar15 != 0) {
        if ((int)uVar15 < 0) goto LAB_00172c0f;
        puVar23 = (info->fdselect).data;
        if (*puVar23 == '\0') {
          if (uVar15 < (uint)uVar19) goto LAB_00172c0f;
          uVar21 = 0;
          if ((uint)uVar19 < uVar15) {
            uVar21 = (uint)puVar23[uVar19];
          }
        }
        else {
          if (*puVar23 == '\x03') {
            uVar16 = 0;
            iVar22 = 1;
            iVar30 = 2;
            do {
              if (iVar22 < (int)uVar15) {
                lVar27 = (long)iVar22;
                iVar22 = iVar22 + 1;
                uVar21 = (uint)puVar23[lVar27];
              }
              else {
                uVar21 = 0;
              }
              uVar16 = uVar16 << 8 | uVar21;
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
            uVar24 = 0;
            iVar30 = 2;
            do {
              if (iVar22 < (int)uVar15) {
                lVar27 = (long)iVar22;
                iVar22 = iVar22 + 1;
                uVar21 = (uint)puVar23[lVar27];
              }
              else {
                uVar21 = 0;
              }
              uVar24 = uVar24 << 8 | uVar21;
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
            if (0 < (int)uVar16) {
              uVar25 = 0;
              do {
                if (iVar22 < (int)uVar15) {
                  lVar27 = (long)iVar22;
                  iVar22 = iVar22 + 1;
                  uVar21 = (uint)puVar23[lVar27];
                }
                else {
                  uVar21 = 0;
                }
                uVar26 = 0;
                iVar30 = 2;
                do {
                  if (iVar22 < (int)uVar15) {
                    lVar27 = (long)iVar22;
                    iVar22 = iVar22 + 1;
                    uVar18 = (uint)puVar23[lVar27];
                  }
                  else {
                    uVar18 = 0;
                  }
                  uVar26 = uVar26 << 8 | uVar18;
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
                if ((int)local_e8 < (int)uVar26 && (int)uVar24 <= (int)local_e8) goto LAB_001728fd;
                uVar25 = uVar25 + 1;
                uVar24 = uVar26;
              } while (uVar25 != uVar16);
            }
          }
          uVar21 = 0xffffffff;
        }
LAB_001728fd:
        stbtt__cff_index_get(info->fontdicts,uVar21);
        sVar39.cursor = in_stack_fffffffffffffdc0;
        sVar39.data = (uchar *)uVar40;
        sVar39.size = iVar41;
        fontdict.cursor = (int)uVar43;
        fontdict.size = (int)(uVar43 >> 0x20);
        fontdict.data = puVar42;
        local_108 = stbtt__get_subrs(sVar39,fontdict);
        iVar30 = 1;
      }
    }
    goto LAB_00172944;
  case 0xb:
    if ((int)puVar42 < 1) {
      return 0;
    }
    puVar42 = (uchar *)(ulong)((int)puVar42 - 1);
    local_238.data._4_4_ = *(undefined4 *)((long)&subr_stack[(long)puVar42].data + 4);
    local_238.data._0_4_ = *(undefined4 *)&subr_stack[(long)puVar42].data;
    local_238.cursor = subr_stack[(long)puVar42].cursor;
    local_238.size = subr_stack[(long)puVar42].size;
    uVar29 = uVar28;
    break;
  case 0xc:
    if (iVar30 <= iVar22) {
      return 0;
    }
    local_238.cursor = iVar20 + 2;
    switch(local_238.data[uVar17]) {
    case '\"':
      if ((int)uVar32 < 7) {
        return 0;
      }
      local_1d8 = CONCAT44(local_1d8._4_4_,s[6]);
      stbtt__csctx_rccurve_to(c,s[0],0.0,s[1],s[2],s[3],0.0);
      fVar38 = -fVar34;
      dy1 = 0.0;
      fVar34 = 0.0;
      fVar33 = (float)local_1d8;
      break;
    case '#':
      if ((int)uVar32 < 0xd) {
        return 0;
      }
      local_1d8 = CONCAT44(local_1d8._4_4_,s[6]);
      local_f8 = s[10];
      local_228 = s[0xb];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar37 = (float)local_1d8;
      fVar34 = local_228;
      fVar35 = fVar33;
      fVar33 = local_f8;
      break;
    case '$':
      if ((int)uVar32 < 9) {
        return 0;
      }
      local_f8 = s[1];
      uStack_f4 = 0;
      uStack_f0 = 0;
      uStack_ec = 0;
      local_228 = s[3];
      local_1d8 = CONCAT44(local_1d8._4_4_,s[5]);
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],0.0);
      fVar37 = (float)local_1d8;
      fVar38 = dy1;
      fVar34 = -(local_f8 + local_228 + dy1);
      fVar35 = fVar36;
      dy1 = 0.0;
      break;
    case '%':
      if ((int)uVar32 < 0xb) {
        return 0;
      }
      local_1d8 = CONCAT44(s[9],s[8]);
      uStack_1e0 = 0;
      uStack_1d0 = 0;
      fVar34 = s[0] + s[2] + s[4] + s[6] + s[8];
      fVar35 = s[1] + s[3] + s[5] + s[7] + s[9];
      fVar37 = ABS(fVar34);
      fVar38 = ABS(fVar35);
      fVar33 = s[10];
      if (fVar37 <= fVar38) {
        fVar33 = -fVar34;
      }
      uVar32 = -(uint)(fVar38 < fVar37);
      uVar15 = ~uVar32 & (uint)s[10];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar37 = fVar36;
      fVar38 = local_1d8._4_4_;
      fVar34 = (float)(uVar15 | (uint)-fVar35 & uVar32);
      fVar35 = (float)local_1d8;
      break;
    default:
      goto switchD_0017222a_default;
    }
    goto LAB_0017238a;
  case 0xe:
    stbtt__csctx_close_shape(c);
    return 1;
  case 0x13:
  case 0x14:
    if (iVar41 != 0) {
      uVar43 = (ulong)(uint)((int)uVar43 + ((int)((int)(uVar28 >> 0x1f) + uVar32) >> 1));
    }
    iVar20 = (int)uVar43 + 7;
    iVar41 = (int)uVar43 + 0xe;
    if (-1 < iVar20) {
      iVar41 = iVar20;
    }
    iVar22 = (iVar41 >> 3) + iVar22;
    if ((iVar22 < 0) || (iVar30 < iVar22)) goto LAB_00172c0f;
    local_238.cursor = iVar22;
    goto LAB_00172603;
  case 0x15:
    if ((int)uVar32 < 2) {
      return 0;
    }
    fVar33 = s[uVar32 - 2];
    fVar34 = s[uVar32 - 1];
    goto LAB_0017246b;
  case 0x16:
    if ((int)uVar32 < 1) {
      return 0;
    }
    fVar33 = s[uVar32 - 1];
    fVar34 = 0.0;
LAB_0017246b:
    stbtt__csctx_rmove_to(c,fVar33,fVar34);
LAB_00172603:
    iVar41 = 0;
LAB_0017260b:
    uVar29 = 0;
    break;
  case 0x18:
    if ((int)uVar32 < 8) {
      return 0;
    }
    lVar27 = -6;
    uVar19 = uVar40;
    do {
      lVar31 = lVar27;
      stbtt__csctx_rccurve_to
                (c,s[lVar31 + 6],s[lVar31 + 7],s[lVar31 + 8],s[lVar31 + 9],s[lVar31 + 10],
                 s[lVar31 + 0xb]);
      lVar27 = lVar31 + 6;
    } while (lVar31 + 6 < (long)(uVar28 - 0xd));
    if ((int)uVar32 <= (int)lVar31 + 0xd) {
      return 0;
    }
    uVar1 = c->x;
    uVar6 = c->y;
    fVar33 = (float)uVar1 + (float)*(undefined8 *)(s + lVar31 + 0xc);
    fVar34 = (float)uVar6 + (float)((ulong)*(undefined8 *)(s + lVar31 + 0xc) >> 0x20);
    c->x = fVar33;
    c->y = fVar34;
    uVar29 = 0;
    stbtt__csctx_v(c,'\x02',(int)fVar33,(int)fVar34,0,0,0,0);
    uVar40 = uVar19;
    break;
  case 0x19:
    if ((int)uVar32 < 8) {
      return 0;
    }
    uVar13 = 2;
    do {
      uVar17 = uVar13;
      uVar3 = c->x;
      uVar8 = c->y;
      fVar33 = (float)uVar3 + (float)*(undefined8 *)(s + (uVar17 - 2));
      fVar34 = (float)uVar8 + (float)((ulong)*(undefined8 *)(s + (uVar17 - 2)) >> 0x20);
      c->x = fVar33;
      c->y = fVar34;
      stbtt__csctx_v(c,'\x02',(int)fVar33,(int)fVar34,0,0,0,0);
      uVar13 = uVar17 + 2;
    } while (uVar17 + 1 < (ulong)(uVar32 - 6));
    if ((int)uVar32 <= (int)(uVar17 + 5)) {
      return 0;
    }
    fVar37 = s[uVar17];
    fVar38 = s[(int)uVar13 + 1];
    fVar34 = s[uVar17 + 5 & 0xffffffff];
    fVar35 = s[uVar13 & 0xffffffff];
    dy1 = s[uVar17 + 1];
    fVar33 = s[(int)uVar13 + 2];
LAB_0017238a:
    stbtt__csctx_rccurve_to(c,fVar37,dy1,fVar35,fVar38,fVar33,fVar34);
    uVar19 = uVar40;
    goto LAB_00172bd3;
  case 0x1a:
  case 0x1b:
    if ((int)uVar32 < 4) {
      return 0;
    }
    uVar13 = (ulong)(uVar32 & 1);
    uVar19 = uVar40;
    if ((uVar32 & 1) + 3 < uVar32) {
      fVar33 = 0.0;
      if ((uVar28 & 1) != 0) {
        fVar33 = s[0];
      }
      do {
        iVar30 = (int)uVar13;
        fVar34 = s[uVar13];
        if (bVar11 == 0x1b) {
          fVar35 = fVar34;
          fVar36 = 0.0;
          fVar37 = s[iVar30 + 3];
          fVar34 = fVar33;
        }
        else {
          fVar37 = 0.0;
          fVar35 = fVar33;
          fVar36 = s[iVar30 + 3];
        }
        stbtt__csctx_rccurve_to(c,fVar35,fVar34,s[uVar13 + 1],s[uVar13 + 2],fVar37,fVar36);
        uVar13 = uVar13 + 4;
        fVar33 = 0.0;
        uVar19 = uVar40;
      } while (iVar30 + 7 < (int)uVar32);
    }
    goto LAB_00172bd3;
  case 0x1d:
    iVar30 = local_224;
LAB_00172944:
    uVar19 = uVar40;
    if ((int)uVar32 < 1) {
      return 0;
    }
    iVar22 = (int)puVar42;
    if (9 < iVar22) {
      return 0;
    }
    fVar33 = s[uVar32 - 1];
    *(undefined4 *)&subr_stack[iVar22].data = local_238.data._0_4_;
    *(undefined4 *)((long)&subr_stack[iVar22].data + 4) = local_238.data._4_4_;
    subr_stack[iVar22].cursor = local_238.cursor;
    subr_stack[iVar22].size = local_238.size;
    piVar14 = &local_108.cursor;
    puVar23 = local_108.data;
    if (bVar11 != 10) {
      puVar23 = (info->gsubrs).data;
      piVar14 = local_e0;
    }
    uVar13 = *(ulong *)piVar14;
    if ((long)uVar13 < 0) {
LAB_00172c0f:
      __assert_fail("!(o > b->size || o < 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imstb_truetype.h"
                    ,0x482,"void stbtt__buf_seek(stbtt__buf *, int)");
    }
    puVar42 = (uchar *)(ulong)(iVar22 + 1);
    uVar21 = 0;
    iVar22 = 2;
    uVar15 = 0;
    do {
      if ((int)uVar21 < (int)(uVar13 >> 0x20)) {
        lVar27 = (long)(int)uVar21;
        uVar21 = uVar21 + 1;
        uVar16 = (uint)puVar23[lVar27];
      }
      else {
        uVar16 = 0;
      }
      uVar15 = uVar15 << 8 | uVar16;
      iVar22 = iVar22 + -1;
    } while (iVar22 != 0);
    uVar16 = (uint)(0x4d7 < (int)uVar15) << 10 | 0x6b;
    if (0x846b < (int)uVar15) {
      uVar16 = 0x8000;
    }
    iVar22 = uVar16 + (int)fVar33;
    sVar39 = (stbtt__buf)ZEXT816(0);
    uVar40 = uVar19;
    if (iVar22 < (int)uVar15 && -1 < iVar22) {
      b._8_8_ = (ulong)uVar21 | uVar13 & 0x7fffffff00000000;
      b.data = puVar23;
      sVar39 = stbtt__cff_index_get(b,iVar22);
    }
    if (sVar39._8_8_ >> 0x20 == 0) {
      return 0;
    }
    local_238.size = sVar39.size;
    local_238.data = sVar39.data;
    local_238.cursor = 0;
    uVar29 = (ulong)(uVar32 - 1);
    local_224 = iVar30;
    break;
  case 0x1e:
    iVar22 = 0;
    if ((int)uVar32 < 4) {
      return 0;
    }
    while (uVar19 = uVar40, iVar22 + 3 < (int)uVar32) {
      iVar30 = iVar22 + 4;
      fVar33 = 0.0;
      if (uVar32 - iVar22 == 5) {
        fVar33 = s[iVar30];
      }
      stbtt__csctx_rccurve_to
                (c,0.0,s[iVar22],s[(long)iVar22 + 1],s[(long)iVar22 + 2],s[iVar22 + 3],fVar33);
LAB_00172ace:
      uVar19 = uVar40;
      if ((int)uVar32 <= iVar30 + 3) break;
      iVar22 = iVar30 + 4;
      fVar33 = 0.0;
      if (uVar32 - iVar30 == 5) {
        fVar33 = s[iVar22];
      }
      stbtt__csctx_rccurve_to
                (c,s[iVar30],0.0,s[(long)iVar30 + 1],s[(long)iVar30 + 2],fVar33,s[iVar30 + 3]);
    }
LAB_00172bd3:
    uVar29 = 0;
    uVar40 = uVar19;
    break;
  case 0x1f:
    iVar30 = 0;
    if (3 < (int)uVar32) goto LAB_00172ace;
    return 0;
  }
  uVar17 = (ulong)(uint)local_238.cursor;
  uVar13 = (ulong)(uint)local_238.size;
  uVar28 = uVar29;
  if (local_238.size <= local_238.cursor) {
    return 0;
  }
  goto LAB_00171fa2;
}

Assistant:

static int stbtt__run_charstring(const stbtt_fontinfo *info, int glyph_index, stbtt__csctx *c)
{
   int in_header = 1, maskbits = 0, subr_stack_height = 0, sp = 0, v, i, b0;
   int has_subrs = 0, clear_stack;
   float s[48];
   stbtt__buf subr_stack[10], subrs = info->subrs, b;
   float f;

#define STBTT__CSERR(s) (0)

   // this currently ignores the initial width value, which isn't needed if we have hmtx
   b = stbtt__cff_index_get(info->charstrings, glyph_index);
   while (b.cursor < b.size) {
      i = 0;
      clear_stack = 1;
      b0 = stbtt__buf_get8(&b);
      switch (b0) {
      // @TODO implement hinting
      case 0x13: // hintmask
      case 0x14: // cntrmask
         if (in_header)
            maskbits += (sp / 2); // implicit "vstem"
         in_header = 0;
         stbtt__buf_skip(&b, (maskbits + 7) / 8);
         break;

      case 0x01: // hstem
      case 0x03: // vstem
      case 0x12: // hstemhm
      case 0x17: // vstemhm
         maskbits += (sp / 2);
         break;

      case 0x15: // rmoveto
         in_header = 0;
         if (sp < 2) return STBTT__CSERR("rmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-2], s[sp-1]);
         break;
      case 0x04: // vmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("vmoveto stack");
         stbtt__csctx_rmove_to(c, 0, s[sp-1]);
         break;
      case 0x16: // hmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("hmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-1], 0);
         break;

      case 0x05: // rlineto
         if (sp < 2) return STBTT__CSERR("rlineto stack");
         for (; i + 1 < sp; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      // hlineto/vlineto and vhcurveto/hvcurveto alternate horizontal and vertical
      // starting from a different place.

      case 0x07: // vlineto
         if (sp < 1) return STBTT__CSERR("vlineto stack");
         goto vlineto;
      case 0x06: // hlineto
         if (sp < 1) return STBTT__CSERR("hlineto stack");
         for (;;) {
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, s[i], 0);
            i++;
      vlineto:
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, 0, s[i]);
            i++;
         }
         break;

      case 0x1F: // hvcurveto
         if (sp < 4) return STBTT__CSERR("hvcurveto stack");
         goto hvcurveto;
      case 0x1E: // vhcurveto
         if (sp < 4) return STBTT__CSERR("vhcurveto stack");
         for (;;) {
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, 0, s[i], s[i+1], s[i+2], s[i+3], (sp - i == 5) ? s[i + 4] : 0.0f);
            i += 4;
      hvcurveto:
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, s[i], 0, s[i+1], s[i+2], (sp - i == 5) ? s[i+4] : 0.0f, s[i+3]);
            i += 4;
         }
         break;

      case 0x08: // rrcurveto
         if (sp < 6) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x18: // rcurveline
         if (sp < 8) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp - 2; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         if (i + 1 >= sp) return STBTT__CSERR("rcurveline stack");
         stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      case 0x19: // rlinecurve
         if (sp < 8) return STBTT__CSERR("rlinecurve stack");
         for (; i + 1 < sp - 6; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         if (i + 5 >= sp) return STBTT__CSERR("rlinecurve stack");
         stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x1A: // vvcurveto
      case 0x1B: // hhcurveto
         if (sp < 4) return STBTT__CSERR("(vv|hh)curveto stack");
         f = 0.0;
         if (sp & 1) { f = s[i]; i++; }
         for (; i + 3 < sp; i += 4) {
            if (b0 == 0x1B)
               stbtt__csctx_rccurve_to(c, s[i], f, s[i+1], s[i+2], s[i+3], 0.0);
            else
               stbtt__csctx_rccurve_to(c, f, s[i], s[i+1], s[i+2], 0.0, s[i+3]);
            f = 0.0;
         }
         break;

      case 0x0A: // callsubr
         if (!has_subrs) {
            if (info->fdselect.size)
               subrs = stbtt__cid_get_glyph_subrs(info, glyph_index);
            has_subrs = 1;
         }
         // FALLTHROUGH
      case 0x1D: // callgsubr
         if (sp < 1) return STBTT__CSERR("call(g|)subr stack");
         v = (int) s[--sp];
         if (subr_stack_height >= 10) return STBTT__CSERR("recursion limit");
         subr_stack[subr_stack_height++] = b;
         b = stbtt__get_subr(b0 == 0x0A ? subrs : info->gsubrs, v);
         if (b.size == 0) return STBTT__CSERR("subr not found");
         b.cursor = 0;
         clear_stack = 0;
         break;

      case 0x0B: // return
         if (subr_stack_height <= 0) return STBTT__CSERR("return outside subr");
         b = subr_stack[--subr_stack_height];
         clear_stack = 0;
         break;

      case 0x0E: // endchar
         stbtt__csctx_close_shape(c);
         return 1;

      case 0x0C: { // two-byte escape
         float dx1, dx2, dx3, dx4, dx5, dx6, dy1, dy2, dy3, dy4, dy5, dy6;
         float dx, dy;
         int b1 = stbtt__buf_get8(&b);
         switch (b1) {
         // @TODO These "flex" implementations ignore the flex-depth and resolution,
         // and always draw beziers.
         case 0x22: // hflex
            if (sp < 7) return STBTT__CSERR("hflex stack");
            dx1 = s[0];
            dx2 = s[1];
            dy2 = s[2];
            dx3 = s[3];
            dx4 = s[4];
            dx5 = s[5];
            dx6 = s[6];
            stbtt__csctx_rccurve_to(c, dx1, 0, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, -dy2, dx6, 0);
            break;

         case 0x23: // flex
            if (sp < 13) return STBTT__CSERR("flex stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = s[10];
            dy6 = s[11];
            //fd is s[12]
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         case 0x24: // hflex1
            if (sp < 9) return STBTT__CSERR("hflex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dx4 = s[5];
            dx5 = s[6];
            dy5 = s[7];
            dx6 = s[8];
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, dy5, dx6, -(dy1+dy2+dy5));
            break;

         case 0x25: // flex1
            if (sp < 11) return STBTT__CSERR("flex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = dy6 = s[10];
            dx = dx1+dx2+dx3+dx4+dx5;
            dy = dy1+dy2+dy3+dy4+dy5;
            if (STBTT_fabs(dx) > STBTT_fabs(dy))
               dy6 = -dy;
            else
               dx6 = -dx;
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         default:
            return STBTT__CSERR("unimplemented");
         }
      } break;

      default:
         if (b0 != 255 && b0 != 28 && b0 < 32)
            return STBTT__CSERR("reserved operator");

         // push immediate
         if (b0 == 255) {
            f = (float)(stbtt_int32)stbtt__buf_get32(&b) / 0x10000;
         } else {
            stbtt__buf_skip(&b, -1);
            f = (float)(stbtt_int16)stbtt__cff_int(&b);
         }
         if (sp >= 48) return STBTT__CSERR("push stack overflow");
         s[sp++] = f;
         clear_stack = 0;
         break;
      }
      if (clear_stack) sp = 0;
   }
   return STBTT__CSERR("no endchar");

#undef STBTT__CSERR
}